

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg_Data.h
# Opt level: O1

void __thiscall Nova::Arg_Data::Print_Synopsis(Arg_Data *this)

{
  Type TVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  
  poVar2 = Log::(anonymous_namespace)::cerr;
  TVar1 = this->type;
  std::__ostream_insert<char,std::char_traits<char>>(Log::(anonymous_namespace)::cerr,"[",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->str)._M_dataplus._M_p,(this->str)._M_string_length);
  if (TVar1 == OPTION) {
    pcVar4 = "]";
    lVar3 = 1;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," <",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(this->val_name)._M_dataplus._M_p,(this->val_name)._M_string_length);
    pcVar4 = ">]";
    lVar3 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  return;
}

Assistant:

void Print_Synopsis() const
    {
        if(type==OPTION) Log::cerr<<"["<<str<<"]";
        else Log::cerr<<"["<<str<<" <"<<val_name<<">]";
    }